

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void __thiscall MercuryJson::JSON::exec_stage2(JSON *this)

{
  JsonValue *pJVar1;
  long lVar2;
  ulong local_78;
  JSON *local_70;
  code *local_68;
  undefined8 local_60;
  thread parse_str_threads [4];
  thread local_38;
  
  parse_str_threads[0]._M_id._M_thread = (id)0;
  parse_str_threads[1]._M_id._M_thread = (id)0;
  parse_str_threads[2]._M_id._M_thread = (id)0;
  parse_str_threads[3]._M_id._M_thread = (id)0;
  for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
    local_68 = _thread_parse_str;
    local_60 = 0;
    local_70 = this;
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long),MercuryJson::JSON*,unsigned_long&,void>
              (&local_38,(type *)&local_68,&local_70,&local_78);
    std::thread::operator=(parse_str_threads + local_78,&local_38);
    std::thread::~thread(&local_38);
  }
  pJVar1 = _parse_value(this);
  this->document = pJVar1;
  if (this->input[*this->idx_ptr] == '\0') {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
      std::thread::join();
    }
    free(this->indices);
    this->indices = (size_t *)0x0;
    lVar2 = 0x18;
    do {
      std::thread::~thread((thread *)((long)&parse_str_threads[0]._M_id._M_thread + lVar2));
      lVar2 = lVar2 + -8;
    } while (lVar2 != -8);
    return;
  }
  _error(this,"file end",this->input[*this->idx_ptr],*this->idx_ptr);
}

Assistant:

void JSON::exec_stage2() {
//        std::chrono::time_point<std::chrono::steady_clock> start_time;
//        std::chrono::duration<double> runtime;
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        std::thread parse_str_threads[PARSE_STR_NUM_THREADS];
        for (size_t i = 0; i < PARSE_STR_NUM_THREADS; ++i)
            parse_str_threads[i] = std::thread(&JSON::_thread_parse_str, this, i);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("thread spawn: %.6lf\n", runtime.count());
#endif

//        start_time = std::chrono::steady_clock::now();
#if SHIFT_REDUCE_PARSER
        document = _shift_reduce_parsing();  // final index is '\0'
#else
        document = _parse_value();
#endif
        char ch = input[*idx_ptr];
        if (ch != '\0') _error("file end", ch, *idx_ptr);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("parse document: %.6lf\n", runtime.count());
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        for (std::thread &thread : parse_str_threads)
            thread.join();
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("wait join: %.6lf\n", runtime.count());
#endif
        aligned_free(indices);
        indices = nullptr;
    }